

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

double pbrt::computeApproximateStorageWeight(SP *scene)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_type sVar4;
  size_type sVar5;
  element_type *peVar6;
  int extraout_var;
  pair<std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Shape>_>,_bool> pVar7;
  shared_ptr<pbrt::Shape> geom_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
  *__range1_1;
  double costEstimate;
  shared_ptr<pbrt::Shape> geom;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *__range2;
  shared_ptr<pbrt::Instance> inst;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *__range1;
  set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
  activeShapes;
  set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
  *in_stack_fffffffffffffec8;
  shared_ptr<pbrt::Instance> *in_stack_fffffffffffffed0;
  float local_124;
  value_type *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  float local_104;
  float local_fc;
  _Self local_c8;
  _Self local_c0;
  undefined1 *local_b8;
  double local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  shared_ptr<pbrt::Shape> *local_78;
  __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
  local_70;
  vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_> *local_68;
  shared_ptr<pbrt::Instance> *local_50;
  __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
  local_48;
  vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
  *local_40;
  undefined1 local_38 [56];
  
  std::
  set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
  ::set((set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
         *)0x1b5cf1);
  std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b5cfb)
  ;
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x1b5d07);
  local_40 = &peVar3->instances;
  local_48._M_current =
       (shared_ptr<pbrt::Instance> *)
       std::
       vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
       begin((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
              *)in_stack_fffffffffffffec8);
  local_50 = (shared_ptr<pbrt::Instance> *)
             std::
             vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
             ::end((vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                    *)in_stack_fffffffffffffec8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                             *)in_stack_fffffffffffffed0,
                            (__normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
                             *)in_stack_fffffffffffffec8), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator*(&local_48);
    std::shared_ptr<pbrt::Instance>::shared_ptr
              (in_stack_fffffffffffffed0,(shared_ptr<pbrt::Instance> *)in_stack_fffffffffffffec8);
    std::__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b5d85);
    peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b5d91);
    local_68 = &peVar3->shapes;
    local_70._M_current =
         (shared_ptr<pbrt::Shape> *)
         std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
         begin((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                *)in_stack_fffffffffffffec8);
    local_78 = (shared_ptr<pbrt::Shape> *)
               std::
               vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
               ::end((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                      *)in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
      ::operator*(&local_70);
      std::shared_ptr<pbrt::Shape>::shared_ptr
                ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffed0,
                 (shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffec8);
      pVar7 = std::
              set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
              ::insert((set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                        *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       in_stack_fffffffffffffee8);
      local_a8 = (_Base_ptr)pVar7.first._M_node;
      local_a0 = pVar7.second;
      std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x1b5e49);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<pbrt::Shape>_*,_std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>_>
      ::operator++(&local_70);
    }
    std::shared_ptr<pbrt::Instance>::~shared_ptr((shared_ptr<pbrt::Instance> *)0x1b5e9b);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::Instance>_*,_std::vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>_>
    ::operator++(&local_48);
  }
  std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b5eb7)
  ;
  peVar3 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x1b5ec3);
  sVar4 = std::
          vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
          ::size(&peVar3->instances);
  local_fc = (float)sVar4;
  sVar5 = std::
          set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          ::size((set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                  *)0x1b5f21);
  local_104 = (float)sVar5;
  local_b0 = (double)(local_fc * 4000.0 + local_104 * 4000.0);
  local_b8 = local_38;
  local_c0._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
       ::begin(in_stack_fffffffffffffec8);
  local_c8._M_node =
       (_Base_ptr)
       std::
       set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
       ::end(in_stack_fffffffffffffec8);
  while (bVar1 = std::operator!=(&local_c0,&local_c8), bVar1) {
    std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Shape>_>::operator*
              ((_Rb_tree_const_iterator<std::shared_ptr<pbrt::Shape>_> *)0x1b5fe5);
    std::shared_ptr<pbrt::Shape>::shared_ptr
              ((shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffed0,
               (shared_ptr<pbrt::Shape> *)in_stack_fffffffffffffec8);
    peVar6 = std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b6001);
    iVar2 = (*(peVar6->super_Entity)._vptr_Entity[5])();
    local_124 = (float)CONCAT44(extraout_var,iVar2);
    if (-1 < extraout_var) {
      local_124 = (float)(long)CONCAT44(extraout_var,iVar2);
    }
    local_b0 = (double)(local_124 * 100.0) + local_b0;
    std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x1b6084);
    std::_Rb_tree_const_iterator<std::shared_ptr<pbrt::Shape>_>::operator++
              ((_Rb_tree_const_iterator<std::shared_ptr<pbrt::Shape>_> *)in_stack_fffffffffffffed0);
  }
  std::
  set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
  ::~set((set<std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::Shape>_>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
          *)0x1b60cf);
  return local_b0;
}

Assistant:

double computeApproximateStorageWeight(Scene::SP scene)
  {
    /*! @{ "guessed" guess-timates of storage cost for a primitive and
      a instance, respectively. For prim, assume 12ish bytes index,
      12ish vertex, 32-ish bvh cost, and a bit for shading data -
      say a round 100?. For a instance, at least the transforms,
      plus bvh overhead, etc .... 4k?. Eventually could/should do
      some fitting of these parameters, and probably make it
      primtype- and material/shading-data dependent (textures ...),
      but for now any approximateion will do */
    static const float primWeight = 100.f;
    static const float instWeight = 4000.f;
    static const float geomWeight = 4000.f;
    
    std::set<Shape::SP> activeShapes;
    for (auto inst : scene->world->instances) 
      for (auto geom : inst->object->shapes) 
        activeShapes.insert(geom);

    double costEstimate
      = scene->world->instances.size() * instWeight
      + activeShapes.size() * geomWeight;
    for (auto geom : activeShapes)
      costEstimate += geom->getNumPrims() * primWeight;
    return costEstimate;
  }